

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAndEaRg<(moira::Instr)9,(moira::Mode)6,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  u32 data;
  u32 ea;
  
  bVar1 = readOp<(moira::Mode)6,(moira::Size)4,128ul>(this,opcode & 7,&ea,&data);
  if (bVar1) {
    uVar2 = (ulong)(opcode >> 9 & 7);
    uVar3 = *(uint *)((long)this->exec + uVar2 * 4 + -0x58) & data;
    (this->reg).sr.n = SUB41(uVar3 >> 0x1f,0);
    (this->reg).sr.z = uVar3 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    prefetch<4ul>(this);
    (*this->_vptr_Moira[0x19])(this,2);
    *(uint *)((long)this->exec + uVar2 * 4 + -0x58) = uVar3;
  }
  return;
}

Assistant:

void
Moira::execAndEaRg(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    u32 result = logic<I,S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(isRegMode(M) || isImmMode(M) ? 4 : 2);
    writeD<S>(dst, result);
}